

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableModel.cpp
# Opt level: O1

TableModel<trackerboy::Waveform> * __thiscall
TableModel<trackerboy::Waveform>::iconData(TableModel<trackerboy::Waveform> *this,int id)

{
  QIcon::QIcon((QIcon *)this);
  return this;
}

Assistant:

QIcon TableModel<T>::iconData(int id) const {
    if constexpr (std::is_same_v<T, trackerboy::Instrument>) {
        auto ch = source().get(id)->channel();
        Icons icons;
        switch (ch) {
            case trackerboy::ChType::ch1:
                icons = Icons::ch1;
                break;
            case trackerboy::ChType::ch2:
                icons = Icons::ch2;
                break;
            case trackerboy::ChType::ch3:
                icons = Icons::ch3;
                break;
            default:
                icons = Icons::ch4;
                break;

        }

        return IconLocator::get(icons);
    } else {
        // no icons for waveforms (yet, potential TODO)
        Q_UNUSED(id);
        return {};
    }
}